

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O3

UChar32 T_UConverter_getNextUChar_UTF32_BE(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  ushort uVar1;
  byte *__src;
  UErrorCode UVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  __src = (byte *)args->source;
  UVar2 = U_INDEX_OUTOFBOUNDS_ERROR;
  if (__src < args->sourceLimit) {
    lVar5 = (long)args->sourceLimit - (long)__src;
    iVar4 = (int)lVar5;
    if (iVar4 < 4) {
      memcpy(args->converter->toUBytes,__src,(long)iVar4);
      args->converter->toULength = (int8_t)lVar5;
      args->source = (char *)(__src + iVar4);
      UVar2 = U_TRUNCATED_CHAR_FOUND;
    }
    else {
      uVar3 = (uint)__src[1] << 0x10 | (uint)*__src << 0x18;
      uVar1 = *(ushort *)(__src + 2);
      args->source = (char *)(__src + 4);
      if ((uVar3 < 0x110000) &&
         (uVar3 = (ushort)(uVar1 << 8 | uVar1 >> 8) | uVar3, (uVar3 & 0x1ff800) != 0xd800)) {
        return uVar3;
      }
      *(undefined4 *)args->converter->toUBytes = *(undefined4 *)__src;
      args->converter->toULength = '\x04';
      UVar2 = U_ILLEGAL_CHAR_FOUND;
    }
  }
  *err = UVar2;
  return 0xffff;
}

Assistant:

static UChar32 U_CALLCONV
T_UConverter_getNextUChar_UTF32_BE(UConverterToUnicodeArgs* args,
                                   UErrorCode* err)
{
    const uint8_t *mySource;
    UChar32 myUChar;
    int32_t length;

    mySource = (const uint8_t *)args->source;
    if (mySource >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    length = (int32_t)((const uint8_t *)args->sourceLimit - mySource);
    if (length < 4) 
    {
        /* got a partial character */
        uprv_memcpy(args->converter->toUBytes, mySource, length);
        args->converter->toULength = (int8_t)length;
        args->source = (const char *)(mySource + length);
        *err = U_TRUNCATED_CHAR_FOUND;
        return 0xffff;
    }

    /* Don't even try to do a direct cast because the value may be on an odd address. */
    myUChar = ((UChar32)mySource[0] << 24)
            | ((UChar32)mySource[1] << 16)
            | ((UChar32)mySource[2] << 8)
            | ((UChar32)mySource[3]);

    args->source = (const char *)(mySource + 4);
    if ((uint32_t)myUChar <= MAXIMUM_UTF && !U_IS_SURROGATE(myUChar)) {
        return myUChar;
    }

    uprv_memcpy(args->converter->toUBytes, mySource, 4);
    args->converter->toULength = 4;

    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}